

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O2

void on_messenger_state_changed_callback
               (void *context,TELEMETRY_MESSENGER_STATE previous_state,
               TELEMETRY_MESSENGER_STATE new_state)

{
  undefined8 in_RAX;
  undefined4 uVar3;
  time_t tVar1;
  LOGGER_LOG p_Var2;
  int iVar4;
  AMQP_DEVICE_INSTANCE_conflict *instance;
  char *pcVar5;
  undefined8 uVar6;
  
  uVar3 = (undefined4)((ulong)in_RAX >> 0x20);
  if (context == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return;
    }
    uVar6 = CONCAT44(uVar3,new_state);
    pcVar5 = 
    "on_messenger_state_changed_callback was invoked with new_state %d, but context is NULL";
    iVar4 = 0xe5;
  }
  else {
    if (new_state == previous_state) {
      return;
    }
    *(TELEMETRY_MESSENGER_STATE *)((long)context + 0x48) = new_state;
    tVar1 = get_time((time_t *)0x0);
    *(time_t *)((long)context + 0x50) = tVar1;
    if (tVar1 != -1) {
      return;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return;
    }
    uVar6 = **context;
    pcVar5 = "Device \'%s\' failed to set time of last messenger state change (get_time failed)";
    iVar4 = 0xee;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
            ,"on_messenger_state_changed_callback",iVar4,1,pcVar5,uVar6);
  return;
}

Assistant:

static void on_messenger_state_changed_callback(void* context, TELEMETRY_MESSENGER_STATE previous_state, TELEMETRY_MESSENGER_STATE new_state)
{
    if (context == NULL)
    {
        LogError("on_messenger_state_changed_callback was invoked with new_state %d, but context is NULL", new_state);
    }
    else if (new_state != previous_state)
    {
        AMQP_DEVICE_INSTANCE* instance = (AMQP_DEVICE_INSTANCE*)context;
        instance->msgr_state = new_state;

        if ((instance->msgr_state_last_changed_time = get_time(NULL)) == INDEFINITE_TIME)
        {
            LogError("Device '%s' failed to set time of last messenger state change (get_time failed)", instance->config->device_id);
        }
    }
}